

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawList
               (ImGuiWindow_conflict *window,ImGuiViewportP_conflict1 *viewport,
               ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow_conflict *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiContext_conflict1 *pIVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ImDrawCmd *pIVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  ImDrawCmd *draw_cmd;
  ImWchar *pIVar18;
  char *pcVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  ImDrawList *local_1e0;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pIVar4 = GImGui;
  iVar17 = (draw_list->CmdBuffer).Size;
  if ((0 < iVar17) &&
     (pIVar9 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer), pIVar9->ElemCount == 0)) {
    pIVar9 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
    iVar17 = iVar17 - (uint)(pIVar9->UserCallback == (ImDrawCallback)0x0);
  }
  pcVar19 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar19 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar19,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar17);
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    if (viewport == (ImGuiViewportP_conflict1 *)0x0) {
      bVar21 = window != (ImGuiWindow_conflict *)0x0;
      bVar22 = false;
      local_1e0 = (ImDrawList *)0x0;
    }
    else {
      local_1e0 = GetForegroundDrawList(&viewport->super_ImGuiViewport);
      bVar21 = window != (ImGuiWindow_conflict *)0x0;
      bVar22 = local_1e0 != (ImDrawList *)0x0;
      if (bVar21 && bVar22) {
        bVar21 = IsItemHovered(0);
        bVar22 = true;
        if (bVar21) {
          buf._4_4_ = (window->Size).y + (window->Pos).y;
          buf._0_4_ = (window->Size).x + (window->Pos).x;
          ImDrawList::AddRect(local_1e0,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0,1.0);
        }
        bVar21 = true;
      }
    }
    if (!bVar6) {
      return;
    }
    if ((bVar21) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    pIVar9 = (draw_list->CmdBuffer).Data;
    for (draw_cmd = pIVar9; draw_cmd < pIVar9 + iVar17; draw_cmd = draw_cmd + 1) {
      if (draw_cmd->UserCallback == (ImDrawCallback)0x0) {
        ImFormatString(buf,300,"DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                       SUB84((double)(draw_cmd->ClipRect).x,0),
                       SUB84((double)(draw_cmd->ClipRect).y,0),(double)(draw_cmd->ClipRect).z,
                       (double)(draw_cmd->ClipRect).w,(ulong)draw_cmd->ElemCount / 3,
                       draw_cmd->TextureId);
        bVar6 = TreeNode((void *)(((long)draw_cmd - (long)(draw_list->CmdBuffer).Data) / 0x38),"%s",
                         buf);
        bVar21 = IsItemHovered(0);
        if (bVar21) {
          bVar21 = (pIVar4->DebugMetricsConfig).ShowDrawCmdMesh;
          if (bVar21 == false) {
            bVar13 = (pIVar4->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
            if ((bVar22 & bVar13) != 0) goto LAB_00191b37;
          }
          else if (bVar22 != false) {
            bVar13 = (pIVar4->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
LAB_00191b37:
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (local_1e0,draw_list,draw_cmd,bVar21,(bool)(bVar13 & 1));
          }
        }
        if (bVar6) {
          if ((draw_list->IdxBuffer).Size < L'\x01') {
            pIVar18 = (ImWchar *)0x0;
          }
          else {
            pIVar18 = (draw_list->IdxBuffer).Data;
          }
          uVar1 = draw_cmd->VtxOffset;
          uVar14 = draw_cmd->IdxOffset;
          pIVar3 = (draw_list->VtxBuffer).Data;
          uVar7 = draw_cmd->ElemCount + uVar14;
          fVar23 = 0.0;
          for (; uVar14 < uVar7; uVar14 = uVar14 + 3) {
            clipper.ItemsFrozen = 0;
            clipper.ItemsHeight = 0.0;
            clipper.DisplayStart = 0;
            clipper.DisplayEnd = 0;
            clipper.ItemsCount = 0;
            clipper.StepNo = 0;
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              uVar16 = (uint)((ulong)uVar14 + lVar15);
              if (pIVar18 != (ImWchar *)0x0) {
                uVar16 = (uint)pIVar18[(ulong)uVar14 + lVar15 & 0xffffffff];
              }
              *(ImVec2 *)(&clipper.DisplayStart + lVar15 * 2) =
                   pIVar3[(ulong)uVar1 + (ulong)uVar16].pos;
            }
            fVar23 = fVar23 + ABS(((float)clipper.DisplayEnd - (float)clipper.StepNo) *
                                  (float)clipper.ItemsFrozen +
                                  ((float)clipper.StepNo - clipper.ItemsHeight) *
                                  (float)clipper.DisplayStart +
                                  (clipper.ItemsHeight - (float)clipper.DisplayEnd) *
                                  (float)clipper.ItemsCount) * 0.5;
          }
          ImFormatString(buf,300,
                         "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                         SUB84((double)fVar23,0));
          clipper.DisplayStart = 0;
          clipper.DisplayEnd = 0;
          Selectable(buf,false,0,(ImVec2 *)&clipper);
          bVar6 = IsItemHovered(0);
          if ((bVar22 & bVar6) != 0) {
            DebugNodeDrawCmdShowMeshAndBoundingBox(local_1e0,draw_list,draw_cmd,true,false);
          }
          clipper.DisplayStart = 0;
          clipper.DisplayEnd = 0;
          clipper.StepNo = 0;
          clipper.ItemsFrozen = 0;
          clipper.ItemsHeight = 0.0;
          clipper.StartPosY = 0.0;
          clipper.ItemsCount = -1;
          ImGuiListClipper::Begin(&clipper,draw_cmd->ElemCount / 3,-1.0);
          while (bVar6 = ImGuiListClipper::Step(&clipper), bVar6) {
            iVar5 = clipper.DisplayEnd;
            uVar20 = (ulong)(clipper.DisplayStart * 3 + draw_cmd->IdxOffset);
            for (iVar11 = clipper.DisplayStart; iVar11 < iVar5; iVar11 = iVar11 + 1) {
              triangle_1[0].x = 0.0;
              triangle_1[0].y = 0.0;
              triangle_1[1].x = 0.0;
              triangle_1[1].y = 0.0;
              triangle_1[2].x = 0.0;
              triangle_1[2].y = 0.0;
              pcVar19 = buf;
              for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
                if (pIVar18 == (ImWchar *)0x0) {
                  uVar14 = (int)uVar20 + (int)lVar15;
                }
                else {
                  uVar14 = (uint)pIVar18[(int)uVar20 + lVar15];
                }
                lVar10 = (long)(int)uVar14;
                triangle_1[lVar15] = pIVar3[(ulong)uVar1 + lVar10].pos;
                pcVar12 = "     ";
                if (lVar15 == 0) {
                  pcVar12 = "Vert:";
                }
                iVar8 = ImFormatString(pcVar19,(size_t)(local_3c + -(long)pcVar19),
                                       "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                       SUB84((double)pIVar3[(ulong)uVar1 + lVar10].pos.x,0),
                                       SUB84((double)pIVar3[(ulong)uVar1 + lVar10].pos.y,0),
                                       (double)pIVar3[(ulong)uVar1 + lVar10].uv.x,
                                       (double)pIVar3[(ulong)uVar1 + lVar10].uv.y,pcVar12,
                                       (uVar20 & 0xffffffff) + lVar15,
                                       (ulong)pIVar3[(ulong)uVar1 + lVar10].col);
                pcVar19 = pcVar19 + iVar8;
              }
              local_190.x = 0.0;
              local_190.y = 0.0;
              Selectable(buf,false,0,&local_190);
              if ((bVar22 != false) && (bVar6 = IsItemHovered(0), bVar6)) {
                uVar14 = local_1e0->Flags;
                local_1e0->Flags = uVar14 & 0xfffffffe;
                ImDrawList::AddPolyline(local_1e0,triangle_1,3,0xff00ffff,1,1.0);
                local_1e0->Flags = uVar14;
              }
              uVar20 = (uVar20 & 0xffffffff) + 3;
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper(&clipper);
        }
      }
      else {
        BulletText("Callback %p, user_data %p",draw_cmd->UserCallback,draw_cmd->UserCallbackData);
      }
      pIVar9 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
    if (window && fg_draw_list && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}